

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::IsGroupOf_PDU::operator==(IsGroupOf_PDU *this,IsGroupOf_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  IsGroupOf_PDU *Value_local;
  IsGroupOf_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                      (&this->m_GroupedEntityID,&Value->m_GroupedEntityID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui8GrpdEntCat == Value->m_ui8GrpdEntCat) {
      if (this->m_ui8NumOfGroupedEnts == Value->m_ui8NumOfGroupedEnts) {
        if (((double)this->m_f64GrpLat != (double)Value->m_f64GrpLat) ||
           (NAN((double)this->m_f64GrpLat) || NAN((double)Value->m_f64GrpLat))) {
          this_local._7_1_ = false;
        }
        else if (((double)this->m_f64GrpLon != (double)Value->m_f64GrpLon) ||
                (NAN((double)this->m_f64GrpLon) || NAN((double)Value->m_f64GrpLon))) {
          this_local._7_1_ = false;
        }
        else {
          bVar2 = std::operator!=(&this->m_vpGED,&Value->m_vpGED);
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL IsGroupOf_PDU::operator == ( const IsGroupOf_PDU & Value ) const
{
    if( Header::operator      !=( Value ) )                    return false;
    if( m_GroupedEntityID     != Value.m_GroupedEntityID )     return false;
    if( m_ui8GrpdEntCat       != Value.m_ui8GrpdEntCat )       return false;
    if( m_ui8NumOfGroupedEnts != Value.m_ui8NumOfGroupedEnts ) return false;
    if( m_f64GrpLat           != Value.m_f64GrpLat )           return false;
    if( m_f64GrpLon           != Value.m_f64GrpLon )           return false;
    if( m_vpGED               != Value.m_vpGED )               return false;
    return true;
}